

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O3

void __thiscall
crnlib::dxt1_endpoint_optimizer::optimize_endpoints
          (dxt1_endpoint_optimizer *this,vec3F *low_color,vec3F *high_color)

{
  void *pvVar1;
  uint8 auVar2 [2];
  uint8 auVar3 [2];
  ushort uVar4;
  unique_color *puVar5;
  uint64 uVar6;
  uchar *puVar7;
  dxt1_block dVar8;
  void *pvVar9;
  vec3F *pvVar10;
  uint16 uVar11;
  uint i;
  int iVar12;
  uint uVar13;
  uint uVar14;
  crn_dxt_quality cVar15;
  long lVar16;
  uint i_4;
  params *ppVar17;
  uint b;
  unsigned_short temp;
  ulong uVar18;
  long lVar19;
  unsigned_short temp_3;
  uint min_new_capacity;
  int iVar20;
  int iVar21;
  uint i_3;
  ulong uVar22;
  uint c;
  dxt1_solution_coordinates *coords;
  ulong uVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  dxt1_solution_coordinates coords_2;
  vec<3U,_float> result_3;
  vec<3U,_float> result_6;
  dxt1_solution_coordinates coords_4;
  vec3F initial_probe_high_color;
  vector<crnlib::unique_color_projection> evaluated_color_projections;
  int prev_packed_color [2];
  vec3F scaled_principle_axis [2];
  vec3F initial_probe_low_color;
  int d [3];
  vec3F orig_high_color;
  vec3F orig_low_color;
  uint probe_high [31];
  uint probe_low [31];
  undefined1 local_24c [4];
  dxt1_block local_248;
  float local_240;
  dxt1_block local_23c;
  int local_230;
  dxt1_solution_coordinates local_22c;
  dxt1_block local_228;
  float local_220;
  uint local_21c;
  elemental_vector local_218;
  vec3F *local_200;
  uint local_1f8 [4];
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  dxt1_endpoint_optimizer *local_1d0;
  undefined1 local_1c8 [16];
  undefined1 *local_1b8;
  long local_1b0;
  void *local_1a8;
  uint local_1a0;
  undefined8 local_19c;
  float local_194;
  dxt1_block local_18c;
  vec3F *local_180;
  int local_174 [3];
  uint64 local_168;
  long local_160;
  vec3F local_158;
  vec3F local_148;
  uint auStack_138 [32];
  uint auStack_b8 [34];
  
  local_148.m_s[2] = low_color->m_s[2];
  local_148.m_s._0_8_ = *(undefined8 *)low_color->m_s;
  local_158.m_s[2] = high_color->m_s[2];
  local_158.m_s._0_8_ = *(undefined8 *)high_color->m_s;
  (this->m_trial_solution).m_coords.m_low_color = 0;
  (this->m_trial_solution).m_coords.m_high_color = 0;
  if ((this->m_trial_solution).m_selectors.m_size != 0) {
    (this->m_trial_solution).m_selectors.m_size = 0;
  }
  (this->m_trial_solution).m_error = 0xffffffffffffffff;
  (this->m_trial_solution).m_alpha_block = false;
  cVar15 = this->m_pParams->m_quality;
  uVar18 = (ulong)cVar15;
  if (uVar18 < 4) {
    fVar25 = *(float *)(&DAT_001b7830 + uVar18 * 4);
    local_1b0 = *(long *)(&DAT_001b7950 + uVar18 * 8);
    local_1b8 = &DAT_001b7940 + *(int *)(&DAT_001b7940 + uVar18 * 4);
    local_1f8[3] = *(uint *)(&DAT_001b7840 + uVar18 * 4);
  }
  else {
    local_1f8[3] = 4;
    local_1b8 = g_uber_probe_table;
    local_1b0 = 0xf;
    fVar25 = 0.015625;
  }
  local_1e8 = CONCAT44(local_1e8._4_4_,fVar25);
  local_200 = low_color;
  if (this->m_pParams->m_endpoint_caching == true) {
    uVar13 = this->m_num_prev_results;
    if (uVar13 != 0) {
      uVar18 = 4;
      if (uVar13 < 4) {
        uVar18 = (ulong)uVar13;
      }
      coords = this->m_prev_results;
      do {
        evaluate_solution(this,coords,false);
        coords = coords + 1;
        uVar18 = uVar18 - 1;
      } while (uVar18 != 0);
    }
    if ((this->m_best_solution).m_error == 0) {
      return_solution(this);
      return;
    }
    cVar15 = this->m_pParams->m_quality;
    fVar25 = (float)local_1e8;
  }
  pvVar10 = local_200;
  if (cCRNDXTQualityNormal < cVar15) {
    try_median4(this,&local_148,&local_158);
    fVar25 = (float)local_1e8;
  }
  lVar16 = 0;
  do {
    *(float *)((long)&local_218.m_p + lVar16 * 4) = (this->m_principle_axis).m_s[lVar16] * fVar25;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 3);
  local_19c = CONCAT44((float)((ulong)local_218.m_p >> 0x20) * 63.0,SUB84(local_218.m_p,0) * 31.0);
  local_194 = (float)local_218.m_size * 31.0;
  lVar16 = 0;
  do {
    *(uint *)((long)&local_218.m_p + lVar16 * 4) =
         *(uint *)((long)&local_19c + lVar16 * 4) ^ 0x80000000;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 3);
  local_1a0 = local_218.m_size;
  local_1a8 = local_218.m_p;
  auVar27 = ZEXT816(0x427c000041f80000);
  fVar25 = (float)*(undefined8 *)pvVar10->m_s * auVar27._0_4_;
  fVar26 = (float)((ulong)*(undefined8 *)pvVar10->m_s >> 0x20) * auVar27._4_4_;
  auVar29._0_12_ = ZEXT812(0x427c000041f80000);
  auVar29._12_4_ = 0;
  auVar30._4_4_ = fVar26;
  auVar30._0_4_ = fVar25;
  auVar30._8_8_ = 0;
  auVar30 = minps(auVar29,auVar30);
  *(ulong *)pvVar10->m_s =
       CONCAT44(-(uint)(0.0 <= fVar26) & auVar30._4_4_,-(uint)(0.0 <= fVar25) & auVar30._0_4_);
  fVar26 = pvVar10->m_s[2] * 31.0;
  fVar25 = 31.0;
  if (fVar26 <= 31.0) {
    fVar25 = fVar26;
  }
  pvVar10->m_s[2] = (float)(~-(uint)(fVar26 < 0.0) & (uint)fVar25);
  auVar31._0_4_ = (float)*(undefined8 *)high_color->m_s * auVar27._0_4_;
  auVar31._4_4_ = (float)((ulong)*(undefined8 *)high_color->m_s >> 0x20) * auVar27._4_4_;
  auVar31._8_8_ = 0;
  auVar30 = minps(auVar27,auVar31);
  fVar25 = (float)(-(uint)(0.0 <= auVar31._0_4_) & auVar30._0_4_);
  fVar26 = (float)(-(uint)(0.0 <= auVar31._4_4_) & auVar30._4_4_);
  local_1e8 = CONCAT44(fVar26,fVar25);
  uStack_1e0 = auVar30._8_8_;
  high_color->m_s[0] = fVar25;
  high_color->m_s[1] = fVar26;
  fVar26 = high_color->m_s[2] * 31.0;
  fVar25 = 31.0;
  if (fVar26 <= 31.0) {
    fVar25 = fVar26;
  }
  fVar25 = (float)(~-(uint)(fVar26 < 0.0) & (uint)fVar25);
  local_1c8 = ZEXT416((uint)fVar25);
  high_color->m_s[2] = fVar25;
  bVar24 = (this->m_perceptual & 1U) != 0;
  iVar21 = 1;
  if (bVar24) {
    iVar21 = 0x19;
  }
  iVar20 = 0x10;
  if (!bVar24) {
    iVar20 = 2;
  }
  lVar16 = 0;
  do {
    iVar12 = iVar21;
    if (((int)lVar16 != 1) && (iVar12 = 2, (int)lVar16 == 0)) {
      iVar12 = iVar20;
    }
    fVar25 = (float)iVar12 * (high_color->m_s[lVar16] - local_200->m_s[lVar16]);
    if (0.0 <= fVar25) {
      fVar25 = floorf(fVar25 + 0.5);
    }
    else {
      fVar25 = floorf(0.5 - fVar25);
      fVar25 = -fVar25;
    }
    local_174[lVar16] = (int)fVar25;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 3);
  min_new_capacity = (this->m_evaluated_colors).m_size;
  local_218.m_p = (void *)0x0;
  local_218.m_size = 0;
  local_218.m_capacity = 0;
  if (min_new_capacity == 0) {
    bVar24 = true;
  }
  else {
    elemental_vector::increase_capacity
              (&local_218,min_new_capacity,min_new_capacity == 1,0x10,
               vector<crnlib::unique_color_projection>::object_mover,false);
    local_218.m_size = min_new_capacity;
    local_1e8 = *(undefined8 *)high_color->m_s;
    uStack_1e0 = 0;
    local_1c8 = ZEXT416((uint)high_color->m_s[2]);
    bVar24 = (this->m_evaluated_colors).m_size == 0;
  }
  pvVar9 = local_218.m_p;
  if (!bVar24) {
    fVar25 = local_200->m_s[0];
    fVar28 = (local_1e8._4_4_ + local_200->m_s[1]) * (float)local_174[1];
    fVar26 = local_200->m_s[2];
    lVar16 = 2;
    uVar18 = 0;
    do {
      puVar5 = (this->m_evaluated_colors).m_p;
      *(ulong *)((long)local_218.m_p + lVar16 * 2 + 4) =
           (ulong)*(uint *)((long)&(puVar5->m_color).field_0 + lVar16 + 2) *
           ((long)(int)((uint)(puVar5->m_color).field_0.c[lVar16] * local_174[2] +
                       (uint)*(byte *)((long)puVar5 + lVar16 + -1) * local_174[1] +
                       (uint)*(byte *)((long)puVar5 + lVar16 + -2) * local_174[0]) -
           (long)(((float)local_1c8._0_4_ + fVar26) * (float)local_174[2] * 4.0 +
                 fVar28 + fVar28 + (fVar25 + (float)local_1e8) * (float)local_174[0] * 4.0));
      puVar5 = (this->m_evaluated_colors).m_p;
      *(undefined1 *)((long)local_218.m_p + lVar16 * 2 + -4) =
           *(undefined1 *)((long)puVar5 + lVar16 + -2);
      *(undefined1 *)((long)local_218.m_p + lVar16 * 2 + -3) =
           *(undefined1 *)((long)puVar5 + lVar16 + -1);
      *(uchar *)((long)local_218.m_p + lVar16 * 2 + -2) = (puVar5->m_color).field_0.c[lVar16];
      *(uchar *)((long)local_218.m_p + lVar16 * 2 + -1) = (puVar5->m_color).field_0.c[lVar16 + 1];
      *(undefined4 *)((long)local_218.m_p + lVar16 * 2) =
           *(undefined4 *)((long)&(puVar5->m_color).field_0 + lVar16 + 2);
      uVar18 = uVar18 + 1;
      lVar16 = lVar16 + 8;
    } while (uVar18 < (this->m_evaluated_colors).m_size);
    min_new_capacity = local_218.m_size;
  }
  local_180 = high_color;
  if (min_new_capacity != 0) {
    lVar19 = (ulong)min_new_capacity * 0x10;
    pvVar1 = (void *)((long)local_218.m_p + lVar19);
    lVar16 = 0x3f;
    if ((ulong)min_new_capacity != 0) {
      for (; min_new_capacity >> lVar16 == 0; lVar16 = lVar16 + -1) {
      }
    }
    std::
    __introsort_loop<crnlib::unique_color_projection*,long,__gnu_cxx::__ops::_Iter_comp_iter<crnlib::__0>>
              (local_218.m_p,pvVar1,((uint)lVar16 ^ 0x3f) * 2 ^ 0x7e);
    if (min_new_capacity < 0x11) {
      std::
      __insertion_sort<crnlib::unique_color_projection*,__gnu_cxx::__ops::_Iter_comp_iter<crnlib::__0>>
                (pvVar9,pvVar1);
    }
    else {
      lVar16 = (long)pvVar9 + 0x100;
      std::
      __insertion_sort<crnlib::unique_color_projection*,__gnu_cxx::__ops::_Iter_comp_iter<crnlib::__0>>
                (pvVar9,lVar16);
      lVar19 = lVar19 + -0x100;
      do {
        std::
        __unguarded_linear_insert<crnlib::unique_color_projection*,__gnu_cxx::__ops::_Val_comp_iter<crnlib::__0>>
                  (lVar16);
        lVar16 = lVar16 + 0x10;
        lVar19 = lVar19 + -0x10;
      } while (lVar19 != 0);
    }
  }
  uVar13 = (this->m_evaluated_colors).m_size;
  if ((ulong)uVar13 != 0) {
    uVar18 = 0;
    do {
      uVar22 = uVar18 >> 1 & 0x7fffffff;
      uVar23 = (ulong)(~(uint)uVar22 + uVar13);
      if ((uVar18 & 1) != 0) {
        uVar23 = uVar22;
      }
      lVar16 = uVar23 * 0x10;
      puVar5 = (this->m_evaluated_colors).m_p;
      puVar5[uVar18].m_color.field_0.field_0.r = *(uchar *)((long)local_218.m_p + lVar16);
      puVar5[uVar18].m_color.field_0.field_0.g = *(uchar *)((long)local_218.m_p + lVar16 + 1);
      puVar5[uVar18].m_color.field_0.field_0.b = *(uchar *)((long)local_218.m_p + lVar16 + 2);
      puVar5[uVar18].m_color.field_0.field_0.a = *(uchar *)((long)local_218.m_p + lVar16 + 3);
      puVar5[uVar18].m_weight = *(uint *)((long)local_218.m_p + lVar16 + 4);
      uVar18 = uVar18 + 1;
    } while (uVar13 != uVar18);
  }
  local_230 = 0;
  local_1d0 = this;
  while( true ) {
    pvVar10 = local_200;
    if (local_230 != 0) {
      dxt1_block::unpack_color(&local_18c,(this->m_best_solution).m_coords.m_low_color,false,0xff);
      *(ulong *)pvVar10->m_s =
           CONCAT44((float)((uint)local_18c._0_4_ >> 8 & 0xff),(float)(local_18c._0_4_ & 0xff));
      pvVar10->m_s[2] = (float)((uint)local_18c._0_4_ >> 0x10 & 0xff);
      dxt1_block::unpack_color(&local_228,(this->m_best_solution).m_coords.m_high_color,false,0xff);
      uVar13 = (uint)local_228.m_high_color[0];
      *(ulong *)local_180->m_s =
           CONCAT44((float)local_228.m_low_color[1],(float)(local_228._0_4_ & 0xff));
      local_180->m_s[2] = (float)uVar13;
    }
    uVar6 = (this->m_best_solution).m_error;
    if (uVar6 == 0) break;
    local_1f8[0] = 0xffffffff;
    local_1f8[1] = 0xffffffff;
    local_228.m_low_color[0] = '\0';
    local_228.m_low_color[1] = '\0';
    local_228.m_high_color[0] = '\0';
    local_228.m_high_color[1] = '?';
    local_228.m_selectors[0] = '\0';
    local_228.m_selectors[1] = '\0';
    local_228.m_selectors[2] = '\0';
    local_228.m_selectors[3] = '?';
    local_220 = 0.5;
    lVar16 = 0;
    do {
      *(float *)(local_18c.m_low_color + lVar16 * 4) =
           pvVar10->m_s[lVar16] + *(float *)(local_228.m_low_color + lVar16 * 4);
      lVar16 = lVar16 + 1;
    } while (lVar16 != 3);
    lVar16 = 0;
    local_21c = 0;
    local_168 = uVar6;
    do {
      uVar18 = (ulong)(lVar16 == 0);
      local_1c8._0_4_ = (float)(int)*(short *)(local_1b8 + lVar16 * 2);
      fVar25 = (float)(int)*(short *)(local_1b8 + lVar16 * 2);
      do {
        lVar19 = 0;
        do {
          *(float *)(local_248.m_low_color + lVar19 * 4) =
               *(float *)((long)&local_1a8 + lVar19 * 4 + uVar18 * 0xc) * fVar25;
          lVar19 = lVar19 + 1;
        } while (lVar19 != 3);
        lVar19 = 0;
        do {
          *(float *)(local_228.m_low_color + lVar19 * 4) =
               *(float *)(local_18c.m_low_color + lVar19 * 4) +
               *(float *)(local_248.m_low_color + lVar19 * 4);
          lVar19 = lVar19 + 1;
        } while (lVar19 != 3);
        local_1e8 = CONCAT44(local_1e8._4_4_,local_228.m_selectors);
        fVar25 = floorf((float)local_228._0_4_);
        iVar21 = (int)fVar25;
        if (0x1e < iVar21) {
          iVar21 = 0x1f;
        }
        if (iVar21 < 1) {
          iVar21 = 0;
        }
        fVar25 = floorf((float)local_1e8);
        iVar20 = (int)fVar25;
        if (0x3e < iVar20) {
          iVar20 = 0x3f;
        }
        if (iVar20 < 1) {
          iVar20 = 0;
        }
        fVar25 = floorf(local_220);
        uVar13 = (uint)fVar25;
        if (0x1e < (int)uVar13) {
          uVar13 = 0x1f;
        }
        if ((int)uVar13 < 1) {
          uVar13 = 0;
        }
        uVar13 = iVar21 << 0xb | iVar20 << 5 | uVar13;
        if (uVar13 != local_1f8[uVar18]) {
          uVar23 = (ulong)local_21c;
          local_21c = local_21c + 1;
          auStack_b8[uVar23] = uVar13;
          local_1f8[uVar18] = uVar13;
        }
        bVar24 = uVar18 == 0;
        uVar18 = 1;
        fVar25 = (float)local_1c8._0_4_;
      } while (bVar24);
      lVar16 = lVar16 + 1;
    } while (lVar16 != local_1b0);
    local_1f8[0] = 0xffffffff;
    local_1f8[1] = 0xffffffff;
    local_248.m_low_color[0] = '\0';
    local_248.m_low_color[1] = '\0';
    local_248.m_high_color[0] = '\0';
    local_248.m_high_color[1] = '?';
    local_248.m_selectors[0] = '\0';
    local_248.m_selectors[1] = '\0';
    local_248.m_selectors[2] = '\0';
    local_248.m_selectors[3] = '?';
    local_240 = 0.5;
    lVar16 = 0;
    do {
      *(float *)(local_228.m_low_color + lVar16 * 4) =
           local_180->m_s[lVar16] + *(float *)(local_248.m_low_color + lVar16 * 4);
      lVar16 = lVar16 + 1;
    } while (lVar16 != 3);
    lVar16 = 0;
    uVar13 = 0;
    do {
      uVar18 = (ulong)(lVar16 == 0);
      local_1c8._0_4_ = (float)(int)*(short *)(local_1b8 + lVar16 * 2);
      fVar25 = (float)(int)*(short *)(local_1b8 + lVar16 * 2);
      local_160 = lVar16;
      do {
        lVar16 = 0;
        do {
          *(float *)(local_23c.m_low_color + lVar16 * 4) =
               *(float *)((long)&local_1a8 + lVar16 * 4 + uVar18 * 0xc) * fVar25;
          lVar16 = lVar16 + 1;
        } while (lVar16 != 3);
        lVar16 = 0;
        do {
          *(float *)(local_248.m_low_color + lVar16 * 4) =
               *(float *)(local_228.m_low_color + lVar16 * 4) +
               *(float *)(local_23c.m_low_color + lVar16 * 4);
          lVar16 = lVar16 + 1;
        } while (lVar16 != 3);
        local_1e8 = CONCAT44(local_1e8._4_4_,local_248.m_selectors);
        fVar25 = floorf((float)local_248._0_4_);
        iVar21 = (int)fVar25;
        if (0x1e < iVar21) {
          iVar21 = 0x1f;
        }
        if (iVar21 < 1) {
          iVar21 = 0;
        }
        fVar25 = floorf((float)local_1e8);
        iVar20 = (int)fVar25;
        if (0x3e < iVar20) {
          iVar20 = 0x3f;
        }
        if (iVar20 < 1) {
          iVar20 = 0;
        }
        fVar25 = floorf(local_240);
        uVar14 = (uint)fVar25;
        if (0x1e < (int)uVar14) {
          uVar14 = 0x1f;
        }
        if ((int)uVar14 < 1) {
          uVar14 = 0;
        }
        uVar14 = iVar21 << 0xb | iVar20 << 5 | uVar14;
        if (uVar14 != local_1f8[uVar18]) {
          uVar23 = (ulong)uVar13;
          uVar13 = uVar13 + 1;
          auStack_138[uVar23] = uVar14;
          local_1f8[uVar18] = uVar14;
        }
        bVar24 = uVar18 == 0;
        uVar18 = 1;
        fVar25 = (float)local_1c8._0_4_;
      } while (bVar24);
      lVar16 = local_160 + 1;
    } while (lVar16 != local_1b0);
    if (local_21c != 0) {
      uVar18 = (ulong)local_21c;
      uVar23 = 0;
      do {
        if (uVar13 != 0) {
          auVar2 = *(uint8 (*) [2])(auStack_b8 + uVar23);
          uVar22 = 0;
          do {
            auVar3 = *(uint8 (*) [2])(auStack_138 + uVar22);
            local_248.m_high_color[0] = auVar3[0];
            local_248.m_high_color[1] = auVar3[1];
            local_248.m_low_color[0] = auVar2[0];
            local_248.m_low_color[1] = auVar2[1];
            if ((ushort)auVar2 < (ushort)auVar3) {
              local_248.m_high_color[0] = auVar2[0];
              local_248.m_high_color[1] = auVar2[1];
              local_248.m_low_color[0] = auVar3[0];
              local_248.m_low_color[1] = auVar3[1];
            }
            local_248.m_low_color[0] = local_248.m_low_color[0];
            local_248.m_low_color[1] = local_248.m_low_color[1];
            local_248.m_high_color[0] = local_248.m_high_color[0];
            local_248.m_high_color[1] = local_248.m_high_color[1];
            evaluate_solution(local_1d0,(dxt1_solution_coordinates *)&local_248,false);
            uVar22 = uVar22 + 1;
          } while (uVar13 != uVar22);
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 != uVar18);
    }
    this = local_1d0;
    if (cCRNDXTQualityFast < local_1d0->m_pParams->m_quality) {
      dxt1_block::unpack_color
                (&local_248,(local_1d0->m_best_solution).m_coords.m_low_color,false,0xff);
      lVar16 = 2;
      do {
        if ((int)(char)(&UNK_001b78ee)[lVar16] + (uint)local_248.m_low_color[0] < 0x20) {
          if ((int)(char)(&UNK_001b78ef)[lVar16] + (uint)local_248.m_low_color[1] < 0x40) {
            if ((int)(char)(&g_adjacency)[lVar16] + (uint)local_248.m_high_color[0] < 0x20) {
              uVar11 = dxt1_block::pack_color
                                 ((int)(char)(&UNK_001b78ee)[lVar16] +
                                  (uint)local_248.m_low_color[0],
                                  (int)(char)(&UNK_001b78ef)[lVar16] +
                                  (uint)local_248.m_low_color[1],
                                  (int)(char)(&g_adjacency)[lVar16] +
                                  (uint)local_248.m_high_color[0],false,0x7f);
              uVar4 = (this->m_best_solution).m_coords.m_high_color;
              local_23c.m_high_color[0] = (char)uVar4;
              local_23c.m_high_color[1] = (char)(uVar4 >> 8);
              local_23c.m_low_color[0] = (char)uVar11;
              local_23c.m_low_color[1] = (char)(uVar11 >> 8);
              if (uVar11 < uVar4) {
                local_23c.m_high_color[0] = (char)uVar11;
                local_23c.m_high_color[1] = (char)(uVar11 >> 8);
                local_23c.m_low_color[0] = (char)uVar4;
                local_23c.m_low_color[1] = (char)(uVar4 >> 8);
              }
              evaluate_solution(this,(dxt1_solution_coordinates *)&local_23c,false);
            }
          }
        }
        lVar16 = lVar16 + 3;
      } while (lVar16 != 0x50);
      if (this->m_pParams->m_quality == cCRNDXTQualityUber) {
        dxt1_block::unpack_color(&local_23c,(this->m_best_solution).m_coords.m_low_color,false,0xff)
        ;
        local_248.m_low_color[0] = local_23c.m_low_color[0];
        local_248.m_low_color[1] = local_23c.m_low_color[1];
        local_248.m_high_color[0] = local_23c.m_high_color[0];
        local_248.m_high_color[1] = local_23c.m_high_color[1];
        lVar16 = 0;
        do {
          iVar21 = -6;
          do {
            dVar8 = local_248;
            local_23c.m_low_color[0] = local_248.m_low_color[0];
            local_23c.m_low_color[1] = local_248.m_low_color[1];
            local_23c.m_high_color[0] = local_248.m_high_color[0];
            local_23c.m_high_color[1] = local_248.m_high_color[1];
            local_248 = dVar8;
            if (iVar21 + (uint)local_23c.m_low_color[lVar16] + 4 <=
                ((uint)(lVar16 == 1) << 5 | 0x1f)) {
              local_23c.m_low_color[lVar16] = local_23c.m_low_color[lVar16] + (char)iVar21 + '\x04';
              local_24c._0_2_ = dxt1_block::pack_color((color_quad_u8 *)&local_23c,false,0x7f);
              uVar4 = (this->m_best_solution).m_coords.m_high_color;
              local_24c._2_2_ = uVar4;
              if ((ushort)local_24c._0_2_ < uVar4) {
                local_24c._2_2_ = local_24c._0_2_;
                local_24c._0_2_ = uVar4;
              }
              evaluate_solution(this,(dxt1_solution_coordinates *)local_24c,false);
            }
            iVar21 = iVar21 + 4;
          } while (iVar21 < -1);
          lVar16 = lVar16 + 1;
        } while (lVar16 != 3);
      }
      dxt1_block::unpack_color(&local_23c,(this->m_best_solution).m_coords.m_high_color,false,0xff);
      lVar16 = 2;
      do {
        uVar13 = (int)(char)(&UNK_001b78ee)[lVar16] + (local_23c._0_4_ & 0xff);
        if (((uVar13 < 0x20) &&
            (uVar14 = (int)(char)(&UNK_001b78ef)[lVar16] + ((uint)local_23c._0_4_ >> 8 & 0xff),
            uVar14 < 0x40)) &&
           (b = (int)(char)(&g_adjacency)[lVar16] + ((uint)local_23c._0_4_ >> 0x10 & 0xff), b < 0x20
           )) {
          uVar4 = (this->m_best_solution).m_coords.m_low_color;
          uVar11 = dxt1_block::pack_color(uVar13,uVar14,b,false,0x7f);
          local_24c._2_2_ = uVar11;
          local_24c._0_2_ = uVar4;
          if (uVar4 < uVar11) {
            local_24c._2_2_ = uVar4;
            local_24c._0_2_ = uVar11;
          }
          evaluate_solution(this,(dxt1_solution_coordinates *)local_24c,false);
        }
        lVar16 = lVar16 + 3;
      } while (lVar16 != 0x50);
      if (this->m_pParams->m_quality == cCRNDXTQualityUber) {
        dxt1_block::unpack_color
                  ((dxt1_block *)local_24c,(this->m_best_solution).m_coords.m_high_color,false,0xff)
        ;
        local_23c.m_low_color[0] = local_24c[0];
        local_23c.m_low_color[1] = local_24c[1];
        local_23c.m_high_color[0] = local_24c[2];
        local_23c.m_high_color[1] = local_24c[3];
        lVar16 = 0;
        do {
          iVar21 = -6;
          do {
            local_24c[0] = local_23c.m_low_color[0];
            local_24c[1] = local_23c.m_low_color[1];
            local_24c[2] = local_23c.m_high_color[0];
            local_24c[3] = local_23c.m_high_color[1];
            if (iVar21 + (uint)(byte)local_24c[lVar16] + 4 <= ((uint)(lVar16 == 1) << 5 | 0x1f)) {
              local_24c[lVar16] = local_24c[lVar16] + (char)iVar21 + '\x04';
              uVar4 = (this->m_best_solution).m_coords.m_low_color;
              local_22c.m_high_color = dxt1_block::pack_color((color_quad_u8 *)local_24c,false,0x7f)
              ;
              local_22c.m_low_color = uVar4;
              if (uVar4 < local_22c.m_high_color) {
                local_22c.m_low_color = local_22c.m_high_color;
                local_22c.m_high_color = uVar4;
              }
              evaluate_solution(local_1d0,&local_22c,false);
              this = local_1d0;
            }
            iVar21 = iVar21 + 4;
          } while (iVar21 < -1);
          lVar16 = lVar16 + 1;
        } while (lVar16 != 3);
      }
    }
    uVar6 = (this->m_best_solution).m_error;
    if ((uVar6 == 0) || (local_230 != 0 && uVar6 == local_168)) break;
    if (cCRNDXTQualityBetter < this->m_pParams->m_quality) {
      refine_solution(this,1);
    }
    local_230 = local_230 + 1;
    if (local_230 == local_1f8[3]) break;
  }
  ppVar17 = this->m_pParams;
  cVar15 = ppVar17->m_quality;
  if (cVar15 < cCRNDXTQualityNormal) goto LAB_00176967;
  if (((this->m_best_solution).m_error != 0) && (ppVar17->m_pixels_have_alpha == false)) {
    uVar13 = (this->m_best_solution).m_selectors.m_size;
    if ((ulong)uVar13 != 0) {
      if (uVar13 != 1) {
        puVar7 = (this->m_best_solution).m_selectors.m_p;
        uVar18 = 1;
        do {
          if (puVar7[uVar18] != *puVar7) goto LAB_0017693e;
          uVar18 = uVar18 + 1;
        } while (uVar13 != uVar18);
      }
      bVar24 = try_average_block_as_solid(this);
      ppVar17 = this->m_pParams;
      if (bVar24) goto LAB_0017694f;
      cVar15 = ppVar17->m_quality;
    }
LAB_0017693e:
    if (cVar15 == cCRNDXTQualityUber) {
      optimize_endpoint_comps(this);
      ppVar17 = this->m_pParams;
    }
  }
LAB_0017694f:
  if ((ppVar17->m_quality == cCRNDXTQualityUber) && ((this->m_best_solution).m_error != 0)) {
    try_combinatorial_encoding(this);
  }
LAB_00176967:
  return_solution(this);
  if (this->m_pParams->m_endpoint_caching == true) {
    uVar13 = this->m_num_prev_results;
    this->m_prev_results[uVar13 & 3] = (this->m_best_solution).m_coords;
    this->m_num_prev_results = uVar13 + 1;
  }
  if (local_218.m_p != (void *)0x0) {
    crnlib_free(local_218.m_p);
  }
  return;
}

Assistant:

void dxt1_endpoint_optimizer::optimize_endpoints(vec3F& low_color, vec3F& high_color) {
  vec3F orig_low_color(low_color);
  vec3F orig_high_color(high_color);

  m_trial_solution.clear();

  uint num_passes;
  const int16* pProbe_table = g_uber_probe_table;
  uint probe_range;
  float dist_per_trial = .015625f;

  // How many probes, and the distance between each probe depends on the quality level.
  switch (m_pParams->m_quality) {
    case cCRNDXTQualitySuperFast:
      pProbe_table = g_fast_probe_table;
      probe_range = cFastProbeTableSize;
      dist_per_trial = .027063293f;
      num_passes = 1;
      break;
    case cCRNDXTQualityFast:
      pProbe_table = g_fast_probe_table;
      probe_range = cFastProbeTableSize;
      dist_per_trial = .027063293f;
      num_passes = 2;
      break;
    case cCRNDXTQualityNormal:
      pProbe_table = g_normal_probe_table;
      probe_range = cNormalProbeTableSize;
      dist_per_trial = .027063293f;
      num_passes = 2;
      break;
    case cCRNDXTQualityBetter:
      pProbe_table = g_better_probe_table;
      probe_range = cBetterProbeTableSize;
      num_passes = 2;
      break;
    default:
      pProbe_table = g_uber_probe_table;
      probe_range = cUberProbeTableSize;
      num_passes = 4;
      break;
  }

  if (m_pParams->m_endpoint_caching) {
    // Try the previous X winning endpoints. This may not give us optimal results, but it may increase the probability of early outs while evaluating potential solutions.
    const uint num_prev_results = math::minimum<uint>(cMaxPrevResults, m_num_prev_results);
    for (uint i = 0; i < num_prev_results; i++)
      evaluate_solution(m_prev_results[i]);

    if (!m_best_solution.m_error) {
      // Got lucky - one of the previous endpoints is optimal.
      return_solution();
      return;
    }
  }

  if (m_pParams->m_quality >= cCRNDXTQualityBetter) {
    //evaluate_solution(dxt1_solution_coordinates(low_color, high_color), true, &m_best_solution);
    //refine_solution();

    try_median4(orig_low_color, orig_high_color);
  }

  uint probe_low[cUberProbeTableSize * 2 + 1];
  uint probe_high[cUberProbeTableSize * 2 + 1];

  vec3F scaled_principle_axis[2];

  scaled_principle_axis[1] = m_principle_axis * dist_per_trial;
  scaled_principle_axis[1][0] *= 31.0f;
  scaled_principle_axis[1][1] *= 63.0f;
  scaled_principle_axis[1][2] *= 31.0f;

  scaled_principle_axis[0] = -scaled_principle_axis[1];

  //vec3F initial_ofs(scaled_principle_axis * (float)-probe_range);
  //initial_ofs[0] += .5f;
  //initial_ofs[1] += .5f;
  //initial_ofs[2] += .5f;

  low_color[0] = math::clamp(low_color[0] * 31.0f, 0.0f, 31.0f);
  low_color[1] = math::clamp(low_color[1] * 63.0f, 0.0f, 63.0f);
  low_color[2] = math::clamp(low_color[2] * 31.0f, 0.0f, 31.0f);

  high_color[0] = math::clamp(high_color[0] * 31.0f, 0.0f, 31.0f);
  high_color[1] = math::clamp(high_color[1] * 63.0f, 0.0f, 63.0f);
  high_color[2] = math::clamp(high_color[2] * 31.0f, 0.0f, 31.0f);

  int d[3];
  for (uint c = 0; c < 3; c++)
    d[c] = math::float_to_int_round((high_color[c] - low_color[c]) * (c == 0 ? m_perceptual ? 16 : 2 : c == 1 ? m_perceptual ? 25 : 1 : 2));
  crnlib::vector<unique_color_projection> evaluated_color_projections(m_evaluated_colors.size());
  int64 average_projection = d[0] * (high_color[0] + low_color[0]) * 4 + d[1] * (high_color[1] + low_color[1]) * 2 + d[2] * (high_color[2] + low_color[2]) * 4;
  for (uint i = 0; i < m_evaluated_colors.size(); i++) {
    int64 delta = d[0] * m_evaluated_colors[i].m_color[0] + d[1] * m_evaluated_colors[i].m_color[1] + d[2] * m_evaluated_colors[i].m_color[2] - average_projection;
    evaluated_color_projections[i].projection = delta * m_evaluated_colors[i].m_weight;
    evaluated_color_projections[i].color = m_evaluated_colors[i];
  }
  std::sort(evaluated_color_projections.begin(), evaluated_color_projections.end(), g_unique_color_projection_sort);
  for (uint i = 0, iEnd = m_evaluated_colors.size(); i < iEnd; i++)
    m_evaluated_colors[i] = evaluated_color_projections[i & 1 ? i >> 1 : iEnd - 1 - (i >> 1)].color;

  for (uint pass = 0; pass < num_passes; pass++) {
    // Now separately sweep or probe the low and high colors along the principle axis, both positively and negatively.
    // This results in two arrays of candidate low/high endpoints. Every unique combination of candidate endpoints is tried as a potential solution.
    // In higher quality modes, the various nearby lattice neighbors of each candidate endpoint are also explored, which allows the current solution to "wobble" or "migrate"
    // to areas with lower error.
    // This entire process can be repeated up to X times (depending on the quality level) until a local minimum is established.
    // This method is very stable and scalable. It could be implemented more elegantly, but I'm now very cautious of touching this code.
    if (pass) {
      color_quad_u8 low(dxt1_block::unpack_color(m_best_solution.m_coords.m_low_color, false));
      low_color = vec3F(low.r, low.g, low.b);
      color_quad_u8 high(dxt1_block::unpack_color(m_best_solution.m_coords.m_high_color, false));
      high_color = vec3F(high.r, high.g, high.b);
    }

    const uint64 prev_best_error = m_best_solution.m_error;
    if (!prev_best_error)
      break;

    // Sweep low endpoint along principle axis, record positions
    int prev_packed_color[2] = {-1, -1};
    uint num_low_trials = 0;
    vec3F initial_probe_low_color(low_color + vec3F(.5f));
    for (uint i = 0; i < probe_range; i++) {
      const int ls = i ? 0 : 1;
      int x = pProbe_table[i];

      for (int s = ls; s < 2; s++) {
        vec3F probe_low_color(initial_probe_low_color + scaled_principle_axis[s] * (float)x);

        int r = math::clamp((int)floor(probe_low_color[0]), 0, 31);
        int g = math::clamp((int)floor(probe_low_color[1]), 0, 63);
        int b = math::clamp((int)floor(probe_low_color[2]), 0, 31);

        int packed_color = b | (g << 5U) | (r << 11U);
        if (packed_color != prev_packed_color[s]) {
          probe_low[num_low_trials++] = packed_color;
          prev_packed_color[s] = packed_color;
        }
      }
    }

    prev_packed_color[0] = -1;
    prev_packed_color[1] = -1;

    // Sweep high endpoint along principle axis, record positions
    uint num_high_trials = 0;
    vec3F initial_probe_high_color(high_color + vec3F(.5f));
    for (uint i = 0; i < probe_range; i++) {
      const int ls = i ? 0 : 1;
      int x = pProbe_table[i];

      for (int s = ls; s < 2; s++) {
        vec3F probe_high_color(initial_probe_high_color + scaled_principle_axis[s] * (float)x);

        int r = math::clamp((int)floor(probe_high_color[0]), 0, 31);
        int g = math::clamp((int)floor(probe_high_color[1]), 0, 63);
        int b = math::clamp((int)floor(probe_high_color[2]), 0, 31);

        int packed_color = b | (g << 5U) | (r << 11U);
        if (packed_color != prev_packed_color[s]) {
          probe_high[num_high_trials++] = packed_color;
          prev_packed_color[s] = packed_color;
        }
      }
    }

    // Now try all unique combinations.
    for (uint i = 0; i < num_low_trials; i++) {
      for (uint j = 0; j < num_high_trials; j++) {
        dxt1_solution_coordinates coords((uint16)probe_low[i], (uint16)probe_high[j]);
        coords.canonicalize();
        evaluate_solution(coords);
      }
    }

    if (m_pParams->m_quality >= cCRNDXTQualityNormal) {
      // Generate new candidates by exploring the low color's direct lattice neighbors
      color_quad_u8 lc(dxt1_block::unpack_color(m_best_solution.m_coords.m_low_color, false));

      for (int i = 0; i < 26; i++) {
        int r = lc.r + g_adjacency[i].x;
        if ((r < 0) || (r > 31))
          continue;

        int g = lc.g + g_adjacency[i].y;
        if ((g < 0) || (g > 63))
          continue;

        int b = lc.b + g_adjacency[i].z;
        if ((b < 0) || (b > 31))
          continue;

        dxt1_solution_coordinates coords(dxt1_block::pack_color(r, g, b, false), m_best_solution.m_coords.m_high_color);
        coords.canonicalize();
        evaluate_solution(coords);
      }

      if (m_pParams->m_quality == cCRNDXTQualityUber) {
        // Generate new candidates by exploring the low color's direct lattice neighbors - this time, explore much further separately on each axis.
        lc = dxt1_block::unpack_color(m_best_solution.m_coords.m_low_color, false);

        for (int a = 0; a < 3; a++) {
          int limit = (a == 1) ? 63 : 31;

          for (int s = -2; s <= 2; s += 4) {
            color_quad_u8 c(lc);
            int q = c[a] + s;
            if ((q < 0) || (q > limit))
              continue;

            c[a] = (uint8)q;

            dxt1_solution_coordinates coords(dxt1_block::pack_color(c, false), m_best_solution.m_coords.m_high_color);
            coords.canonicalize();
            evaluate_solution(coords);
          }
        }
      }

      // Generate new candidates by exploring the high color's direct lattice neighbors
      color_quad_u8 hc(dxt1_block::unpack_color(m_best_solution.m_coords.m_high_color, false));

      for (int i = 0; i < 26; i++) {
        int r = hc.r + g_adjacency[i].x;
        if ((r < 0) || (r > 31))
          continue;

        int g = hc.g + g_adjacency[i].y;
        if ((g < 0) || (g > 63))
          continue;

        int b = hc.b + g_adjacency[i].z;
        if ((b < 0) || (b > 31))
          continue;

        dxt1_solution_coordinates coords(m_best_solution.m_coords.m_low_color, dxt1_block::pack_color(r, g, b, false));
        coords.canonicalize();
        evaluate_solution(coords);
      }

      if (m_pParams->m_quality == cCRNDXTQualityUber) {
        // Generate new candidates by exploring the high color's direct lattice neighbors - this time, explore much further separately on each axis.
        hc = dxt1_block::unpack_color(m_best_solution.m_coords.m_high_color, false);

        for (int a = 0; a < 3; a++) {
          int limit = (a == 1) ? 63 : 31;

          for (int s = -2; s <= 2; s += 4) {
            color_quad_u8 c(hc);
            int q = c[a] + s;
            if ((q < 0) || (q > limit))
              continue;

            c[a] = (uint8)q;

            dxt1_solution_coordinates coords(m_best_solution.m_coords.m_low_color, dxt1_block::pack_color(c, false));
            coords.canonicalize();
            evaluate_solution(coords);
          }
        }
      }
    }

    if ((!m_best_solution.m_error) || ((pass) && (m_best_solution.m_error == prev_best_error)))
      break;

    if (m_pParams->m_quality >= cCRNDXTQualityUber) {
      // Attempt to refine current solution's endpoints given the current selectors using least squares.
      refine_solution(1);
    }
  }

  if (m_pParams->m_quality >= cCRNDXTQualityNormal) {
    if ((m_best_solution.m_error) && (!m_pParams->m_pixels_have_alpha)) {
      bool choose_solid_block = false;
      if (m_best_solution.are_selectors_all_equal()) {
        // All selectors equal - try various solid-block optimizations
        choose_solid_block = try_average_block_as_solid();
      }

      if ((!choose_solid_block) && (m_pParams->m_quality == cCRNDXTQualityUber)) {
        // Per-component 1D endpoint optimization.
        optimize_endpoint_comps();
      }
    }

    if (m_pParams->m_quality == cCRNDXTQualityUber) {
      if (m_best_solution.m_error) {
        // The pixels may have already been DXTc compressed by another compressor.
        // It's usually possible to recover the endpoints used to previously pack the block.
        try_combinatorial_encoding();
      }
    }
  }

  return_solution();

  if (m_pParams->m_endpoint_caching) {
    // Remember result for later reruse.
    m_prev_results[m_num_prev_results & (cMaxPrevResults - 1)] = m_best_solution.m_coords;
    m_num_prev_results++;
  }
}